

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_writer.cpp
# Opt level: O2

void __thiscall Json::StyledWriter::writeCommentBeforeValue(StyledWriter *this,Value *root)

{
  string *psVar1;
  bool bVar2;
  _Alloc_hider _Var3;
  string local_40;
  
  bVar2 = Value::hasComment(root,commentBefore);
  if (bVar2) {
    psVar1 = &this->document_;
    std::__cxx11::string::append((char *)psVar1);
    writeIndent(this);
    Value::getComment_abi_cxx11_(&local_40,root,commentBefore);
    for (_Var3._M_p = local_40._M_dataplus._M_p;
        _Var3._M_p != local_40._M_dataplus._M_p + local_40._M_string_length;
        _Var3._M_p = _Var3._M_p + 1) {
      std::__cxx11::string::push_back((char)psVar1);
      if (((*_Var3._M_p == '\n') &&
          (_Var3._M_p != local_40._M_dataplus._M_p + local_40._M_string_length)) &&
         (_Var3._M_p[1] == '/')) {
        writeIndent(this);
      }
    }
    std::__cxx11::string::append((char *)psVar1);
    std::__cxx11::string::~string((string *)&local_40);
  }
  return;
}

Assistant:

void StyledWriter::writeCommentBeforeValue(const Value& root) {
  if (!root.hasComment(commentBefore))
    return;

  document_ += "\n";
  writeIndent();
  const JSONCPP_STRING& comment = root.getComment(commentBefore);
  JSONCPP_STRING::const_iterator iter = comment.begin();
  while (iter != comment.end()) {
    document_ += *iter;
    if (*iter == '\n' &&
       (iter != comment.end() && *(iter + 1) == '/'))
      writeIndent();
    ++iter;
  }

  // Comments are stripped of trailing newlines, so add one here
  document_ += "\n";
}